

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_send_op.hpp
# Opt level: O0

status asio::detail::reactive_socket_send_op_base<asio::const_buffers_1>::do_perform
                 (reactor_op *base)

{
  socket_type s;
  ulong uVar1;
  bool bVar2;
  void *data;
  size_t sVar3;
  const_buffer local_50;
  const_buffer local_40;
  const_buffer local_30;
  status local_1c;
  reactor_op *prStack_18;
  status result;
  reactive_socket_send_op_base<asio::const_buffers_1> *o;
  reactor_op *base_local;
  
  s = *(socket_type *)&base[1].super_operation.next_;
  prStack_18 = base;
  o = (reactive_socket_send_op_base<asio::const_buffers_1> *)base;
  local_30 = buffer_sequence_adapter<asio::const_buffer,_asio::const_buffers_1>::first
                       ((const_buffers_1 *)&base[1].super_operation.func_);
  data = const_buffer::data(&local_30);
  local_40 = buffer_sequence_adapter<asio::const_buffer,_asio::const_buffers_1>::first
                       ((const_buffers_1 *)&prStack_18[1].super_operation.func_);
  sVar3 = const_buffer::size(&local_40);
  bVar2 = socket_ops::non_blocking_send1
                    (s,data,sVar3,prStack_18[1].ec_._M_value,&prStack_18->ec_,
                     &prStack_18->bytes_transferred_);
  local_1c = (status)bVar2;
  if ((local_1c == done) && (((ulong)prStack_18[1].super_operation.next_ & 0x1000000000) != 0)) {
    uVar1 = prStack_18->bytes_transferred_;
    local_50 = buffer_sequence_adapter<asio::const_buffer,_asio::const_buffers_1>::first
                         ((const_buffers_1 *)&prStack_18[1].super_operation.func_);
    sVar3 = const_buffer::size(&local_50);
    if (uVar1 < sVar3) {
      local_1c = done_and_exhausted;
    }
  }
  return local_1c;
}

Assistant:

static status do_perform(reactor_op* base)
  {
    reactive_socket_send_op_base* o(
        static_cast<reactive_socket_send_op_base*>(base));

    typedef buffer_sequence_adapter<asio::const_buffer,
        ConstBufferSequence> bufs_type;

    status result;
    if (bufs_type::is_single_buffer)
    {
      result = socket_ops::non_blocking_send1(o->socket_,
          bufs_type::first(o->buffers_).data(),
          bufs_type::first(o->buffers_).size(), o->flags_,
          o->ec_, o->bytes_transferred_) ? done : not_done;

      if (result == done)
        if ((o->state_ & socket_ops::stream_oriented) != 0)
          if (o->bytes_transferred_ < bufs_type::first(o->buffers_).size())
            result = done_and_exhausted;
    }
    else
    {
      bufs_type bufs(o->buffers_);
      result = socket_ops::non_blocking_send(o->socket_,
            bufs.buffers(), bufs.count(), o->flags_,
            o->ec_, o->bytes_transferred_) ? done : not_done;

      if (result == done)
        if ((o->state_ & socket_ops::stream_oriented) != 0)
          if (o->bytes_transferred_ < bufs.total_size())
            result = done_and_exhausted;
    }

    ASIO_HANDLER_REACTOR_OPERATION((*o, "non_blocking_send",
          o->ec_, o->bytes_transferred_));

    return result;
  }